

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinflate.c
# Opt level: O3

int tinf_uncompress(void *dest,uint *destLen,void *source,uint sourceLen)

{
  long lVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  undefined1 local_678 [15];
  undefined4 uStack_669;
  char local_578;
  undefined1 local_530 [668];
  undefined1 local_294 [16];
  undefined1 local_284 [16];
  short asStack_274 [288];
  int local_34;
  
  local_530._8_8_ = (ulong)sourceLen + (long)source;
  local_530._16_4_ = 0;
  local_530._20_4_ = 0;
  local_530._24_4_ = 0;
  local_530._48_8_ = (ulong)*destLen + (long)dest;
  local_530._0_8_ = source;
  local_530._32_8_ = dest;
  local_530._40_8_ = dest;
  do {
    uVar3 = tinf_getbits((tinf_data *)local_530,1);
    uVar4 = tinf_getbits((tinf_data *)local_530,2);
    if (uVar4 == 2) {
      uVar4 = tinf_getbits((tinf_data *)local_530,5);
      uVar4 = uVar4 + 0x101;
      uVar5 = tinf_getbits((tinf_data *)local_530,5);
      uVar6 = tinf_getbits((tinf_data *)local_530,4);
      if (0x11e < uVar4) {
        return -3;
      }
      uVar5 = uVar5 + 1;
      if (0x1e < uVar5) {
        return -3;
      }
      local_678 = SUB1615((undefined1  [16])0x0,0);
      uStack_669 = 0;
      if (uVar6 + 4 != 0) {
        uVar13 = 0;
        do {
          uVar7 = tinf_getbits((tinf_data *)local_530,3);
          local_678[(byte)(&tinf_decode_trees_clcidx)[uVar13]] = (char)uVar7;
          uVar13 = uVar13 + 1;
        } while (uVar6 + 4 != uVar13);
      }
      iVar11 = tinf_build_tree((tinf_tree *)(local_530 + 0x38),local_678,0x13);
      if (iVar11 != 0) {
        return iVar11;
      }
      if (local_530._664_4_ == -1) {
        return -3;
      }
      uVar6 = uVar5 + uVar4;
      if (uVar6 != 0) {
        uVar7 = 0;
        do {
          uVar8 = tinf_decode_symbol((tinf_data *)local_530,(tinf_tree *)(local_530 + 0x38));
          if ((int)local_530._664_4_ < (int)uVar8) {
            return -3;
          }
          if ((short)uVar8 == 0x12) {
            iVar12 = 0xb;
            iVar11 = 7;
            uVar8 = 0;
LAB_00101a32:
            uVar9 = tinf_getbits((tinf_data *)local_530,iVar11);
            uVar9 = uVar9 + iVar12;
            if (uVar9 <= uVar6 - uVar7) goto joined_r0x00101a4d;
            return -3;
          }
          iVar12 = 3;
          if ((uVar8 & 0xffff) == 0x11) {
            uVar8 = 0;
            iVar11 = 3;
            goto LAB_00101a32;
          }
          if ((uVar8 & 0xffff) == 0x10) {
            if (uVar7 == 0) {
              return -3;
            }
            uVar8 = (uint)(byte)local_678[uVar7 - 1];
            iVar11 = 2;
            goto LAB_00101a32;
          }
          if (uVar6 == uVar7) {
            return -3;
          }
          uVar9 = 1;
          do {
            local_678[uVar7] = (char)uVar8;
            uVar9 = uVar9 - 1;
            uVar7 = uVar7 + 1;
joined_r0x00101a4d:
          } while (uVar9 != 0);
        } while (uVar7 < uVar6);
        if (local_578 == '\0') {
          return -3;
        }
      }
      iVar11 = tinf_build_tree((tinf_tree *)(local_530 + 0x38),local_678,uVar4);
      if (iVar11 != 0) {
        return iVar11;
      }
      iVar11 = tinf_build_tree((tinf_tree *)local_294,local_678 + uVar4,uVar5);
      if (iVar11 != 0) {
        return iVar11;
      }
      iVar11 = tinf_inflate_block_data
                         ((tinf_data *)local_530,(tinf_tree *)(local_530 + 0x38),
                          (tinf_tree *)local_294);
LAB_00101af8:
      if (iVar11 != 0) {
        return iVar11;
      }
    }
    else {
      if (uVar4 == 1) {
        local_530._76_2_ = 0;
        local_530._78_2_ = 0;
        local_530._80_2_ = 0;
        local_530._82_2_ = 0;
        local_530._84_2_ = 0;
        local_530._86_2_ = 0;
        local_530._56_2_ = 0;
        local_530._58_2_ = 0;
        local_530._60_2_ = 0;
        local_530._62_2_ = 0;
        local_530._64_2_ = 0;
        local_530._66_2_ = 0;
        local_530._68_2_ = 0;
        local_530._70_2_ = 0x18;
        local_530._72_2_ = 0x98;
        local_530._74_2_ = 0x70;
        local_530._88_2_ = 0x100;
        local_530._90_2_ = 0x101;
        local_530._92_2_ = 0x102;
        local_530._94_2_ = 0x103;
        local_530._96_2_ = 0x104;
        local_530._98_2_ = 0x105;
        local_530._100_2_ = 0x106;
        local_530._102_2_ = 0x107;
        local_530._104_2_ = 0x108;
        local_530._106_2_ = 0x109;
        local_530._108_2_ = 0x10a;
        local_530._110_2_ = 0x10b;
        local_530._112_2_ = 0x10c;
        local_530._114_2_ = 0x10d;
        local_530._116_2_ = 0x10e;
        local_530._118_2_ = 0x10f;
        local_530._120_2_ = 0x110;
        local_530._122_2_ = 0x111;
        local_530._124_2_ = 0x112;
        local_530._126_2_ = 0x113;
        local_530._128_2_ = 0x114;
        local_530._130_2_ = 0x115;
        local_530._132_2_ = 0x116;
        local_530._134_2_ = 0x117;
        lVar10 = 0x44;
        sVar14 = 0;
        sVar15 = 1;
        sVar16 = 2;
        sVar17 = 3;
        sVar18 = 4;
        sVar19 = 5;
        sVar20 = 6;
        sVar21 = 7;
        do {
          lVar1 = lVar10 * 2;
          *(short *)(local_530 + lVar1) = sVar14;
          *(short *)(local_530 + lVar1 + 2) = sVar15;
          *(short *)(local_530 + lVar1 + 4) = sVar16;
          *(short *)(local_530 + lVar1 + 6) = sVar17;
          *(short *)(local_530 + lVar1 + 8) = sVar18;
          *(short *)(local_530 + lVar1 + 10) = sVar19;
          *(short *)(local_530 + lVar1 + 0xc) = sVar20;
          *(short *)(local_530 + lVar1 + 0xe) = sVar21;
          sVar14 = sVar14 + 8;
          sVar15 = sVar15 + 8;
          sVar16 = sVar16 + 8;
          sVar17 = sVar17 + 8;
          sVar18 = sVar18 + 8;
          sVar19 = sVar19 + 8;
          sVar20 = sVar20 + 8;
          sVar21 = sVar21 + 8;
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0xd4);
        local_530._424_2_ = 0x118;
        local_530._426_2_ = 0x119;
        local_530._428_2_ = 0x11a;
        local_530._430_2_ = 0x11b;
        local_530._432_2_ = 0x11c;
        local_530._434_2_ = 0x11d;
        local_530._436_2_ = 0x11e;
        local_530._438_2_ = 0x11f;
        lVar10 = 0xdc;
        sVar14 = 0;
        sVar15 = 1;
        sVar16 = 2;
        sVar17 = 3;
        sVar18 = 4;
        sVar19 = 5;
        sVar20 = 6;
        sVar21 = 7;
        do {
          lVar1 = lVar10 * 2;
          *(short *)(local_530 + lVar1) = sVar14 + 0x90;
          *(short *)(local_530 + lVar1 + 2) = sVar15 + 0x90;
          *(short *)(local_530 + lVar1 + 4) = sVar16 + 0x90;
          *(short *)(local_530 + lVar1 + 6) = sVar17 + 0x90;
          *(short *)(local_530 + lVar1 + 8) = sVar18 + 0x90;
          *(short *)(local_530 + lVar1 + 10) = sVar19 + 0x90;
          *(short *)(local_530 + lVar1 + 0xc) = sVar20 + 0x90;
          *(short *)(local_530 + lVar1 + 0xe) = sVar21 + 0x90;
          sVar14 = sVar14 + 8;
          sVar15 = sVar15 + 8;
          sVar16 = sVar16 + 8;
          sVar17 = sVar17 + 8;
          sVar18 = sVar18 + 8;
          sVar19 = sVar19 + 8;
          sVar20 = sVar20 + 8;
          sVar21 = sVar21 + 8;
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x14c);
        local_530._664_4_ = 0x11d;
        local_284 = (undefined1  [16])0x0;
        local_294._0_10_ = SUB1610((undefined1  [16])0x0,0);
        local_294._10_2_ = 0x20;
        local_294._12_4_ = 0;
        lVar10 = 0x15e;
        sVar14 = 0;
        sVar15 = 1;
        sVar16 = 2;
        sVar17 = 3;
        sVar18 = 4;
        sVar19 = 5;
        sVar20 = 6;
        sVar21 = 7;
        do {
          lVar1 = lVar10 * 2;
          *(short *)(local_530 + lVar1) = sVar14;
          *(short *)(local_530 + lVar1 + 2) = sVar15;
          *(short *)(local_530 + lVar1 + 4) = sVar16;
          *(short *)(local_530 + lVar1 + 6) = sVar17;
          *(short *)(local_530 + lVar1 + 8) = sVar18;
          *(short *)(local_530 + lVar1 + 10) = sVar19;
          *(short *)(local_530 + lVar1 + 0xc) = sVar20;
          *(short *)(local_530 + lVar1 + 0xe) = sVar21;
          sVar14 = sVar14 + 8;
          sVar15 = sVar15 + 8;
          sVar16 = sVar16 + 8;
          sVar17 = sVar17 + 8;
          sVar18 = sVar18 + 8;
          sVar19 = sVar19 + 8;
          sVar20 = sVar20 + 8;
          sVar21 = sVar21 + 8;
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x17e);
        local_34 = 0x1d;
        iVar11 = tinf_inflate_block_data
                           ((tinf_data *)local_530,(tinf_tree *)(local_530 + 0x38),
                            (tinf_tree *)local_294);
        goto LAB_00101af8;
      }
      if (uVar4 != 0) {
        return -3;
      }
      if ((long)(local_530._8_8_ - local_530._0_8_) < 4) {
        return -3;
      }
      uVar2 = *(ushort *)local_530._0_8_;
      uVar4 = (uint)uVar2;
      if ((*(ushort *)(local_530._0_8_ + 2) ^ uVar2) != 0xffff) {
        return -3;
      }
      local_530._0_8_ = local_530._0_8_ + 4;
      if ((long)(local_530._8_8_ - local_530._0_8_) < (long)(ulong)uVar2) {
        return -3;
      }
      if ((long)(local_530._48_8_ - local_530._40_8_) < (long)(ulong)uVar2) {
        return -5;
      }
      if (uVar2 != 0) {
        do {
          uVar2 = *(ushort *)local_530._0_8_;
          local_530._0_8_ = local_530._0_8_ + 1;
          *(uchar *)local_530._40_8_ = (uchar)uVar2;
          local_530._40_8_ = local_530._40_8_ + 1;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      local_530._16_4_ = 0;
      local_530._20_4_ = 0;
    }
    if (uVar3 != 0) {
      iVar11 = -3;
      if (local_530._24_4_ == 0) {
        *destLen = local_530._40_4_ - local_530._32_4_;
        iVar11 = 0;
      }
      return iVar11;
    }
  } while( true );
}

Assistant:

int tinf_uncompress(void *dest, unsigned int *destLen,
                    const void *source, unsigned int sourceLen)
{
	struct tinf_data d;
	int bfinal;

	/* Initialise data */
	d.source = (const unsigned char *) source;
	d.source_end = d.source + sourceLen;
	d.tag = 0;
	d.bitcount = 0;
	d.overflow = 0;

	d.dest = (unsigned char *) dest;
	d.dest_start = d.dest;
	d.dest_end = d.dest + *destLen;

	do {
		unsigned int btype;
		int res;

		/* Read final block flag */
		bfinal = tinf_getbits(&d, 1);

		/* Read block type (2 bits) */
		btype = tinf_getbits(&d, 2);

		/* Decompress block */
		switch (btype) {
		case 0:
			/* Decompress uncompressed block */
			res = tinf_inflate_uncompressed_block(&d);
			break;
		case 1:
			/* Decompress block with fixed Huffman trees */
			res = tinf_inflate_fixed_block(&d);
			break;
		case 2:
			/* Decompress block with dynamic Huffman trees */
			res = tinf_inflate_dynamic_block(&d);
			break;
		default:
			res = TINF_DATA_ERROR;
			break;
		}

		if (res != TINF_OK) {
			return res;
		}
	} while (!bfinal);

	/* Check for overflow in bit reader */
	if (d.overflow) {
		return TINF_DATA_ERROR;
	}

	*destLen = d.dest - d.dest_start;

	return TINF_OK;
}